

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

void __thiscall
Centaurus::CharClass<unsigned_char>::append(CharClass<unsigned_char> *this,Range<unsigned_char> *r)

{
  pointer pRVar1;
  pointer pRVar2;
  Range<unsigned_char> *pRVar3;
  size_type __n;
  Range<unsigned_char> *pRVar4;
  pointer pRVar5;
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  *this_00;
  long lVar6;
  Range<unsigned_char> *pRVar7;
  pointer pRVar8;
  
  this_00 = &this->m_ranges;
  pRVar8 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pRVar8) && (pRVar8[-1].m_end == r->m_start)) {
    pRVar8[-1].m_end = r->m_end;
    return;
  }
  pRVar8 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar8 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pRVar8->_vptr_Range = (_func_int **)&PTR__Range_001a1570;
    pRVar8->m_start = r->m_start;
    pRVar8->m_end = r->m_end;
    (this->m_ranges).
    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar8 + 1;
    return;
  }
  __n = std::
        vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
        _M_check_len(this_00,1,"vector::_M_realloc_insert");
  pRVar1 = (this_00->
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pRVar8 - (long)pRVar1 >> 4;
  if (__n == 0) {
    pRVar4 = (Range<unsigned_char> *)0x0;
  }
  else {
    pRVar4 = __gnu_cxx::new_allocator<Centaurus::Range<unsigned_char>_>::allocate
                       ((new_allocator<Centaurus::Range<unsigned_char>_> *)this_00,__n,(void *)0x0);
  }
  pRVar4[lVar6]._vptr_Range = (_func_int **)&PTR__Range_001a1570;
  pRVar4[lVar6].m_start = r->m_start;
  pRVar4[lVar6].m_end = r->m_end;
  pRVar7 = pRVar4;
  for (pRVar5 = pRVar1; pRVar5 != pRVar8; pRVar5 = pRVar5 + 1) {
    pRVar7->_vptr_Range = (_func_int **)&PTR__Range_001a1570;
    pRVar7->m_start = pRVar5->m_start;
    pRVar7->m_end = pRVar5->m_end;
    pRVar7 = pRVar7 + 1;
  }
  for (; pRVar3 = pRVar7 + 1, pRVar5 = pRVar1, pRVar2 != pRVar8; pRVar8 = pRVar8 + 1) {
    pRVar3->_vptr_Range = (_func_int **)&PTR__Range_001a1570;
    pRVar7[1].m_start = pRVar8->m_start;
    pRVar7[1].m_end = pRVar8->m_end;
    pRVar7 = pRVar3;
  }
  for (; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1) {
    (**pRVar5->_vptr_Range)(pRVar5);
  }
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1);
  }
  (this_00->
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = pRVar4;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar4 + __n;
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }